

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O3

bool __thiscall
miniros::Subscription::addCallback
          (Subscription *this,SubscriptionCallbackHelperPtr *helper,string *md5sum,
          CallbackQueueInterface *queue,int32_t queue_size,VoidConstPtr *tracked_object,
          bool allow_concurrent_callbacks)

{
  _Rb_tree_header *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  element_type *peVar4;
  CallbackQueueInterface *pCVar5;
  element_type *peVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  int iVar8;
  _Base_ptr p_Var9;
  Subscription *pSVar10;
  _Base_ptr p_Var11;
  pointer psVar12;
  pthread_mutex_t *__mutex;
  bool bVar13;
  bool was_full;
  bool allow_concurrent_callbacks_local;
  pthread_mutex_t *local_98;
  Subscription *local_90;
  shared_ptr<miniros::MessageDeserializer> des;
  CallbackInfoPtr info;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  int32_t queue_size_local;
  element_type *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pthread_mutex_t *local_40;
  SubscriptionCallbackHelperPtr *local_38;
  
  allow_concurrent_callbacks_local = allow_concurrent_callbacks;
  local_98 = (pthread_mutex_t *)queue;
  queue_size_local = queue_size;
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->md5sum_mutex_);
  if (iVar8 == 0) {
    local_90 = this;
    iVar8 = std::__cxx11::string::compare((char *)&this->md5sum_);
    if ((iVar8 == 0) && (iVar8 = std::__cxx11::string::compare((char *)md5sum), iVar8 != 0)) {
      std::__cxx11::string::_M_assign((string *)&this->md5sum_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->md5sum_mutex_);
    iVar8 = std::__cxx11::string::compare((char *)md5sum);
    if (iVar8 != 0) {
      md5sum_abi_cxx11_((string *)&info,local_90);
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)md5sum->_M_string_length;
      if (p_Var2 == info.
                    super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi) {
        if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar13 = false;
        }
        else {
          iVar8 = bcmp((md5sum->_M_dataplus)._M_p,
                       info.
                       super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(size_t)p_Var2);
          bVar13 = iVar8 != 0;
        }
      }
      else {
        bVar13 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)info.
             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr != &local_68) {
        operator_delete(info.
                        super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,local_68._M_allocated_capacity + 1);
      }
      if (bVar13) {
        return false;
      }
    }
    __mutex = (pthread_mutex_t *)&local_90->callbacks_mutex_;
    iVar8 = pthread_mutex_lock(__mutex);
    if (iVar8 == 0) {
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
      (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count = 1;
      (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = 1;
      (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_002abe50;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)
               (info.
                super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 1);
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_use_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[1]._M_weak_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_use_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[2]._M_weak_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_use_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[3]._M_weak_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_use_count = 0;
      info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi[4]._M_weak_count = 0;
      *(element_type **)
       &info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi[1]._M_use_count =
           (helper->
           super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 (info.
                  super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi + 2),
                 &(helper->
                  super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount);
      (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->callback_queue_ = (CallbackQueueInterface *)local_98;
      std::__shared_ptr<miniros::SubscriptionQueue,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<miniros::SubscriptionQueue>,std::__cxx11::string&,int&,bool&>
                ((__shared_ptr<miniros::SubscriptionQueue,(__gnu_cxx::_Lock_policy)2> *)&des,
                 (allocator<miniros::SubscriptionQueue> *)&local_50,&local_90->name_,
                 &queue_size_local,&allow_concurrent_callbacks_local);
      _Var7 = des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      peVar6 = des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = ((info.
                 super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->subscription_queue_).
               super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->subscription_queue_).
      super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar6;
      ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->subscription_queue_).
      super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var7._M_pi;
      if ((p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2),
         des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      ((info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((info.
                    super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr)->tracked_object_).
                  super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 &(tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->has_tracked_object_ =
           (tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
           (element_type *)0x0;
      iVar8 = (*((helper->
                 super___shared_ptr<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->_vptr_SubscriptionCallbackHelper[5])();
      if ((char)iVar8 == '\0') {
        local_90->nonconst_callbacks_ = local_90->nonconst_callbacks_ + 1;
      }
      std::
      vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
      ::push_back(&local_90->callbacks_,&info);
      std::
      vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
      ::reserve(&local_90->cached_deserializers_,
                (long)(local_90->callbacks_).
                      super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_90->callbacks_).
                      super__Vector_base<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4);
      pSVar10 = local_90;
      if ((local_90->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        local_40 = (pthread_mutex_t *)&local_90->publisher_links_mutex_;
        local_98 = __mutex;
        iVar8 = pthread_mutex_lock(local_40);
        if (iVar8 != 0) {
          std::__throw_system_error(iVar8);
        }
        psVar12 = (pSVar10->publisher_links_).
                  super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar3 = (pSVar10->publisher_links_).
                 super__Vector_base<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (psVar12 != psVar3) {
          p_Var1 = &(pSVar10->latched_messages_)._M_t._M_impl.super__Rb_tree_header;
          local_38 = helper;
          do {
            peVar4 = (psVar12->
                     super___shared_ptr<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            p_Var9 = (pSVar10->latched_messages_)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
            p_Var11 = &p_Var1->_M_header;
            if ((p_Var9 != (_Base_ptr)0x0 & peVar4->latched_) == 1) {
              do {
                if (*(element_type **)(p_Var9 + 1) >= peVar4) {
                  p_Var11 = p_Var9;
                }
                p_Var9 = (&p_Var9->_M_left)[*(element_type **)(p_Var9 + 1) < peVar4];
              } while (p_Var9 != (_Base_ptr)0x0);
              if (((_Rb_tree_header *)p_Var11 != p_Var1) &&
                 (*(element_type **)(p_Var11 + 1) <= peVar4)) {
                des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<miniros::MessageDeserializer,std::allocator<miniros::MessageDeserializer>,std::shared_ptr<miniros::SubscriptionCallbackHelper>const&,miniros::SerializedMessage_const&,std::shared_ptr<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>const&>
                          (&des.
                            super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,(MessageDeserializer **)&des,
                           (allocator<miniros::MessageDeserializer> *)&local_50,helper,
                           (SerializedMessage *)&p_Var11[1]._M_left,
                           (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            *)&p_Var11[3]._M_right);
                was_full = false;
                SubscriptionQueue::push
                          (((info.
                             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->subscription_queue_).
                           super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,&(info.
                                     super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->helper_,&des,
                           (info.
                            super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->has_tracked_object_,
                           &(info.
                             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->tracked_object_,true,(Time)p_Var11[4]._M_parent,&was_full);
                if (was_full == false) {
                  pCVar5 = (info.
                            super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->callback_queue_;
                  local_50 = ((info.
                               super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->subscription_queue_).
                             super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr;
                  local_48 = ((info.
                               super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->subscription_queue_).
                             super___shared_ptr<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      local_48->_M_use_count = local_48->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      local_48->_M_use_count = local_48->_M_use_count + 1;
                    }
                  }
                  (*pCVar5->_vptr_CallbackQueueInterface[2])
                            (pCVar5,&local_50,
                             info.
                             super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
                  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
                  }
                }
                pSVar10 = local_90;
                helper = local_38;
                if (des.super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (des.
                             super___shared_ptr<miniros::MessageDeserializer,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                  pSVar10 = local_90;
                  helper = local_38;
                }
              }
            }
            psVar12 = psVar12 + 1;
          } while (psVar12 != psVar3);
        }
        pthread_mutex_unlock(local_40);
        __mutex = local_98;
      }
      if (info.super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (info.
                   super___shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      pthread_mutex_unlock(__mutex);
      return true;
    }
  }
  std::__throw_system_error(iVar8);
}

Assistant:

bool Subscription::addCallback(const SubscriptionCallbackHelperPtr& helper, const std::string& md5sum,
  CallbackQueueInterface* queue, int32_t queue_size, const VoidConstPtr& tracked_object, bool allow_concurrent_callbacks)
{
  MINIROS_ASSERT(helper);
  MINIROS_ASSERT(queue);


  // Decay to a real type as soon as we have a subscriber with a real type
  {
    std::scoped_lock<std::mutex> lock(md5sum_mutex_);
    if (md5sum_ == "*" && md5sum != "*")
    {

      md5sum_ = md5sum;
    }
  }

  if (md5sum != "*" && md5sum != this->md5sum())
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(callbacks_mutex_);

    CallbackInfoPtr info(std::make_shared<CallbackInfo>());
    info->helper_ = helper;
    info->callback_queue_ = queue;
    info->subscription_queue_ = std::make_shared<SubscriptionQueue>(name_, queue_size, allow_concurrent_callbacks);
    info->tracked_object_ = tracked_object;
    info->has_tracked_object_ = false;
    if (tracked_object)
    {
      info->has_tracked_object_ = true;
    }

    if (!helper->isConst())
    {
      ++nonconst_callbacks_;
    }

    callbacks_.push_back(info);
    cached_deserializers_.reserve(callbacks_.size());

    // if we have any latched links, we need to immediately schedule callbacks
    if (!latched_messages_.empty())
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

      for (const PublisherLinkPtr& link: publisher_links_)
      {
        if (!link->isLatched())
          continue;

        auto des_it = latched_messages_.find(link);
        if (des_it == latched_messages_.end())
          continue;

        const LatchInfo& latch_info = des_it->second;
        auto des = std::make_shared<MessageDeserializer>(helper, latch_info.message, latch_info.connection_header);
        bool was_full = false;
        info->subscription_queue_->push(info->helper_, des, info->has_tracked_object_, info->tracked_object_, true, latch_info.receipt_time, &was_full);
        if (!was_full)
        {
          info->callback_queue_->addCallback(info->subscription_queue_, (uint64_t)info.get());
        }
      }
    }
  }

  return true;
}